

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonString.h
# Opt level: O0

Data * __thiscall Json::JsonString::data(Data *__return_storage_ptr__,JsonString *this)

{
  JsonString *this_local;
  
  Data::Data(__return_storage_ptr__,&this->__str,0.0,false);
  return __return_storage_ptr__;
}

Assistant:

Data data() const override { return Data{__str}; }